

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

int nsvg__parseTransformArgs(char *str,float *args,int maxNa,int *na)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *s;
  int iVar4;
  float *pfVar5;
  long lVar6;
  double dVar7;
  char it [64];
  char local_78 [72];
  
  pfVar5 = (float *)(ulong)(uint)maxNa;
  *na = 0;
  for (lVar6 = 0; str[lVar6] != '\0'; lVar6 = lVar6 + 1) {
    if (str[lVar6] == '(') {
      s = (byte *)(str + lVar6);
      cVar1 = '(';
      goto LAB_0011646b;
    }
  }
LAB_00116481:
  lVar6 = 1;
  goto LAB_00116486;
LAB_0011646b:
  if (cVar1 == '\0') goto LAB_00116481;
  if (cVar1 == ')') {
    if (str + lVar6 <= s) goto LAB_00116486;
    iVar3 = 0;
    goto LAB_001164a6;
  }
  cVar1 = str[lVar6 + 1];
  lVar6 = lVar6 + 1;
  goto LAB_0011646b;
LAB_001164a6:
  do {
    bVar2 = *s;
    if ((ulong)bVar2 < 0x2f) {
      pfVar5 = (float *)0x0;
      iVar4 = 0;
      if ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0) goto LAB_001164f9;
LAB_001164c1:
      if (maxNa <= iVar3) {
        lVar6 = 0;
        break;
      }
      s = (byte *)nsvg__parseNumber((char *)s,local_78,iVar4);
      dVar7 = nsvg__atof(local_78);
      iVar4 = *na;
      iVar3 = iVar4 + 1;
      *na = iVar3;
      args[iVar4] = (float)dVar7;
      pfVar5 = args;
    }
    else {
LAB_001164f9:
      iVar4 = (int)pfVar5;
      if (0xf5 < (byte)(bVar2 - 0x3a)) goto LAB_001164c1;
      s = s + 1;
    }
  } while (s < str + lVar6);
LAB_00116486:
  return (int)lVar6;
}

Assistant:

static int nsvg__parseTransformArgs(const char* str, float* args, int maxNa, int* na)
{
	const char* end;
	const char* ptr;
	char it[64];

	*na = 0;
	ptr = str;
	while (*ptr && *ptr != '(') ++ptr;
	if (*ptr == 0)
		return 1;
	end = ptr;
	while (*end && *end != ')') ++end;
	if (*end == 0)
		return 1;

	while (ptr < end) {
		if (*ptr == '-' || *ptr == '+' || *ptr == '.' || nsvg__isdigit(*ptr)) {
			if (*na >= maxNa) return 0;
			ptr = nsvg__parseNumber(ptr, it, 64);
			args[(*na)++] = (float)nsvg__atof(it);
		} else {
			++ptr;
		}
	}
	return (int)(end - str);
}